

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

void __thiscall icu_63::RegexCompile::nextChar(RegexCompile *this,RegexPatternChar *c)

{
  UText *pUVar1;
  UBool UVar2;
  UChar32 UVar3;
  uint uVar4;
  UnicodeSet *this_00;
  long lVar5;
  long local_70;
  long local_68;
  int local_54;
  int32_t ch;
  int index;
  int64_t __offset_1;
  URegexUTextUnescapeCharContext context;
  int32_t offset;
  int64_t __offset;
  long lStack_20;
  int32_t endIndex;
  int64_t pos;
  RegexPatternChar *c_local;
  RegexCompile *this_local;
  
  pos = (int64_t)c;
  c_local = (RegexPatternChar *)this;
  if (this->fRXPat->fPattern->nativeIndexingLimit < this->fRXPat->fPattern->chunkOffset) {
    local_68 = (*this->fRXPat->fPattern->pFuncs->mapOffsetToNative)(this->fRXPat->fPattern);
  }
  else {
    local_68 = this->fRXPat->fPattern->chunkNativeStart + (long)this->fRXPat->fPattern->chunkOffset;
  }
  this->fScanIndex = local_68;
  UVar3 = nextCharLL(this);
  *(UChar32 *)pos = UVar3;
  *(undefined1 *)(pos + 4) = 0;
  if (this->fQuoteMode == '\0') {
    if (this->fInBackslashQuote == '\0') {
      if ((this->fModeFlags & 4U) != 0) {
        while (*(int *)pos != -1) {
          if ((*(int *)pos == 0x23) && (this->fEOLComments == '\x01')) {
            do {
              UVar3 = nextCharLL(this);
              *(UChar32 *)pos = UVar3;
              if ((*(int *)pos == -1) ||
                 (((*(int *)pos == 0xd || (*(int *)pos == 10)) || (*(int *)pos == 0x85)))) break;
            } while (*(int *)pos != 0x2028);
          }
          UVar2 = PatternProps::isWhiteSpace(*(UChar32 *)pos);
          if (UVar2 == '\0') break;
          UVar3 = nextCharLL(this);
          *(UChar32 *)pos = UVar3;
        }
      }
      if (*(int *)pos == 0x5c) {
        if (this->fRXPat->fPattern->nativeIndexingLimit < this->fRXPat->fPattern->chunkOffset) {
          local_70 = (*this->fRXPat->fPattern->pFuncs->mapOffsetToNative)(this->fRXPat->fPattern);
        }
        else {
          local_70 = this->fRXPat->fPattern->chunkNativeStart +
                     (long)this->fRXPat->fPattern->chunkOffset;
        }
        lStack_20 = local_70;
        this_00 = (UnicodeSet *)(RegexStaticSets::gStaticSets + 0x578);
        UVar3 = peekCharLL(this);
        UVar2 = UnicodeSet::contains(this_00,UVar3);
        if (UVar2 == '\0') {
          UVar3 = peekCharLL(this);
          if (UVar3 == 0x30) {
            *(undefined4 *)pos = 0;
            nextCharLL(this);
            for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
              uVar4 = peekCharLL(this);
              if (((int)uVar4 < 0x30) || (0x37 < (int)uVar4)) {
                if (local_54 == 0) {
                  error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
                }
                break;
              }
              *(int *)pos = *(int *)pos << 3;
              *(uint *)pos = (uVar4 & 7) + *(int *)pos;
              if (*(int *)pos < 0x100) {
                nextCharLL(this);
              }
              else {
                *(int *)pos = *(int *)pos >> 3;
              }
            }
            *(undefined1 *)(pos + 4) = 1;
          }
          else {
            UVar3 = peekCharLL(this);
            if (UVar3 == 0x51) {
              this->fQuoteMode = '\x01';
              nextCharLL(this);
              nextChar(this,(RegexPatternChar *)pos);
            }
            else {
              this->fInBackslashQuote = '\x01';
            }
          }
        }
        else {
          nextCharLL(this);
          *(undefined1 *)(pos + 4) = 1;
          if (((this->fRXPat->fPattern->chunkNativeStart == 0) &&
              (this->fPatternLength == this->fRXPat->fPattern->chunkNativeLimit)) &&
             (this->fPatternLength == (long)this->fRXPat->fPattern->nativeIndexingLimit)) {
            __offset._4_4_ = (int)lStack_20;
            UVar3 = u_unescapeAt_63(uregex_ucstr_unescape_charAt_63,(int32_t *)((long)&__offset + 4)
                                    ,(int32_t)this->fPatternLength,
                                    this->fRXPat->fPattern->chunkContents);
            *(UChar32 *)pos = UVar3;
            if (__offset._4_4_ == lStack_20) {
              error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
            }
            this->fCharNum = (__offset._4_4_ - lStack_20) + this->fCharNum;
            lVar5 = (long)__offset._4_4_ - this->fRXPat->fPattern->chunkNativeStart;
            if (((lVar5 < 0) || (this->fRXPat->fPattern->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fRXPat->fPattern->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fRXPat->fPattern,(long)__offset._4_4_);
            }
            else {
              this->fRXPat->fPattern->chunkOffset = (int32_t)lVar5;
            }
          }
          else {
            context._12_4_ = 0;
            __offset_1 = (int64_t)this->fRXPat->fPattern;
            context.text._0_4_ = -1;
            lVar5 = lStack_20 - this->fRXPat->fPattern->chunkNativeStart;
            if (((lVar5 < 0) || (this->fRXPat->fPattern->nativeIndexingLimit <= lVar5)) ||
               (0xdbff < (ushort)this->fRXPat->fPattern->chunkContents[lVar5])) {
              utext_setNativeIndex_63(this->fRXPat->fPattern,lStack_20);
            }
            else {
              this->fRXPat->fPattern->chunkOffset = (int32_t)lVar5;
            }
            UVar3 = u_unescapeAt_63(uregex_utext_unescape_charAt_63,(int32_t *)&context.field_0xc,
                                    0x7fffffff,&__offset_1);
            *(UChar32 *)pos = UVar3;
            if (context._12_4_ == 0) {
              error(this,U_REGEX_BAD_ESCAPE_SEQUENCE);
            }
            else if ((int)context.text == context._12_4_) {
              if ((this->fRXPat->fPattern->chunkOffset < 1) ||
                 (0xd7ff < (ushort)this->fRXPat->fPattern->chunkContents
                                   [this->fRXPat->fPattern->chunkOffset + -1])) {
                utext_previous32_63(this->fRXPat->fPattern);
              }
              else {
                pUVar1 = this->fRXPat->fPattern;
                pUVar1->chunkOffset = pUVar1->chunkOffset + -1;
              }
            }
            else if ((int)context.text != context._12_4_ + -1) {
              utext_moveIndex32_63(this->fRXPat->fPattern,(context._12_4_ - (int)context.text) + -1)
              ;
            }
            this->fCharNum = (long)(int)context._12_4_ + this->fCharNum;
          }
        }
      }
    }
    else {
      this->fInBackslashQuote = '\0';
    }
  }
  else {
    *(undefined1 *)(pos + 4) = 1;
    if ((((*(int *)pos == 0x5c) && (UVar3 = peekCharLL(this), UVar3 == 0x45)) &&
        ((this->fModeFlags & 0x10U) == 0)) || (*(int *)pos == -1)) {
      this->fQuoteMode = '\0';
      nextCharLL(this);
      nextChar(this,(RegexPatternChar *)pos);
    }
  }
  this->fEOLComments = '\x01';
  return;
}

Assistant:

void RegexCompile::nextChar(RegexPatternChar &c) {

    fScanIndex = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    c.fChar    = nextCharLL();
    c.fQuoted  = FALSE;

    if (fQuoteMode) {
        c.fQuoted = TRUE;
        if ((c.fChar==chBackSlash && peekCharLL()==chE && ((fModeFlags & UREGEX_LITERAL) == 0)) ||
            c.fChar == (UChar32)-1) {
            fQuoteMode = FALSE;  //  Exit quote mode,
            nextCharLL();        // discard the E
            nextChar(c);         // recurse to get the real next char
        }
    }
    else if (fInBackslashQuote) {
        // The current character immediately follows a '\'
        // Don't check for any further escapes, just return it as-is.
        // Don't set c.fQuoted, because that would prevent the state machine from
        //    dispatching on the character.
        fInBackslashQuote = FALSE;
    }
    else
    {
        // We are not in a \Q quoted region \E of the source.
        //
        if (fModeFlags & UREGEX_COMMENTS) {
            //
            // We are in free-spacing and comments mode.
            //  Scan through any white space and comments, until we
            //  reach a significant character or the end of inut.
            for (;;) {
                if (c.fChar == (UChar32)-1) {
                    break;     // End of Input
                }
                if  (c.fChar == chPound && fEOLComments == TRUE) {
                    // Start of a comment.  Consume the rest of it, until EOF or a new line
                    for (;;) {
                        c.fChar = nextCharLL();
                        if (c.fChar == (UChar32)-1 ||  // EOF
                            c.fChar == chCR        ||
                            c.fChar == chLF        ||
                            c.fChar == chNEL       ||
                            c.fChar == chLS)       {
                            break;
                        }
                    }
                }
                // TODO:  check what Java & Perl do with non-ASCII white spaces.  Ticket 6061.
                if (PatternProps::isWhiteSpace(c.fChar) == FALSE) {
                    break;
                }
                c.fChar = nextCharLL();
            }
        }

        //
        //  check for backslash escaped characters.
        //
        if (c.fChar == chBackSlash) {
            int64_t pos = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
            if (RegexStaticSets::gStaticSets->fUnescapeCharSet.contains(peekCharLL())) {
                //
                // A '\' sequence that is handled by ICU's standard unescapeAt function.
                //   Includes \uxxxx, \n, \r, many others.
                //   Return the single equivalent character.
                //
                nextCharLL();                 // get & discard the peeked char.
                c.fQuoted = TRUE;

                if (UTEXT_FULL_TEXT_IN_CHUNK(fRXPat->fPattern, fPatternLength)) {
                    int32_t endIndex = (int32_t)pos;
                    c.fChar = u_unescapeAt(uregex_ucstr_unescape_charAt, &endIndex, (int32_t)fPatternLength, (void *)fRXPat->fPattern->chunkContents);

                    if (endIndex == pos) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    }
                    fCharNum += endIndex - pos;
                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, endIndex);
                } else {
                    int32_t offset = 0;
                    struct URegexUTextUnescapeCharContext context = U_REGEX_UTEXT_UNESCAPE_CONTEXT(fRXPat->fPattern);

                    UTEXT_SETNATIVEINDEX(fRXPat->fPattern, pos);
                    c.fChar = u_unescapeAt(uregex_utext_unescape_charAt, &offset, INT32_MAX, &context);

                    if (offset == 0) {
                        error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                    } else if (context.lastOffset == offset) {
                        UTEXT_PREVIOUS32(fRXPat->fPattern);
                    } else if (context.lastOffset != offset-1) {
                        utext_moveIndex32(fRXPat->fPattern, offset - context.lastOffset - 1);
                    }
                    fCharNum += offset;
                }
            }
            else if (peekCharLL() == chDigit0) {
                //  Octal Escape, using Java Regexp Conventions
                //    which are \0 followed by 1-3 octal digits.
                //    Different from ICU Unescape handling of Octal, which does not
                //    require the leading 0.
                //  Java also has the convention of only consuming 2 octal digits if
                //    the three digit number would be > 0xff
                //
                c.fChar = 0;
                nextCharLL();    // Consume the initial 0.
                int index;
                for (index=0; index<3; index++) {
                    int32_t ch = peekCharLL();
                    if (ch<chDigit0 || ch>chDigit7) {
                        if (index==0) {
                           // \0 is not followed by any octal digits.
                           error(U_REGEX_BAD_ESCAPE_SEQUENCE);
                        }
                        break;
                    }
                    c.fChar <<= 3;
                    c.fChar += ch&7;
                    if (c.fChar <= 255) {
                        nextCharLL();
                    } else {
                        // The last digit made the number too big.  Forget we saw it.
                        c.fChar >>= 3;
                    }
                }
                c.fQuoted = TRUE;
            }
            else if (peekCharLL() == chQ) {
                //  "\Q"  enter quote mode, which will continue until "\E"
                fQuoteMode = TRUE;
                nextCharLL();       // discard the 'Q'.
                nextChar(c);        // recurse to get the real next char.
            }
            else
            {
                // We are in a '\' escape that will be handled by the state table scanner.
                // Just return the backslash, but remember that the following char is to
                //  be taken literally.
                fInBackslashQuote = TRUE;
            }
        }
    }

    // re-enable # to end-of-line comments, in case they were disabled.
    // They are disabled by the parser upon seeing '(?', but this lasts for
    //  the fetching of the next character only.
    fEOLComments = TRUE;

    // putc(c.fChar, stdout);
}